

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6522Implementation.hpp
# Opt level: O3

void __thiscall
MOS::MOS6522::MOS6522<Apple::II::Mockingboard::AYVIA>::do_phase1
          (MOS6522<Apple::II::Mockingboard::AYVIA> *this)

{
  uint8_t *puVar1;
  bool bVar2;
  AYVIA *pAVar3;
  byte bVar4;
  bool bVar5;
  
  (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ =
       (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ + 1;
  if ((((this->super_MOS6522Storage).registers_.timer[1] == 0xffff) &&
      ((this->super_MOS6522Storage).registers_.last_timer[1] == 0)) &&
     ((this->super_MOS6522Storage).timer_is_running_[1] == true)) {
    (this->super_MOS6522Storage).timer_is_running_[1] = false;
    bVar4 = (this->super_MOS6522Storage).registers_.auxiliary_control >> 2 & 7;
    if ((bVar4 == 5) || (bVar4 == 4)) {
      shift_out(this);
    }
    else if (bVar4 == 1) {
      shift_in(this);
    }
    bVar2 = (this->super_MOS6522Storage).last_posted_interrupt_status_;
    bVar4 = (this->super_MOS6522Storage).registers_.interrupt_flags | 0x20;
    (this->super_MOS6522Storage).registers_.interrupt_flags = bVar4;
    bVar5 = (bVar4 & (this->super_MOS6522Storage).registers_.interrupt_enable & 0x7f) != 0;
    if (bVar2 != bVar5) {
      (this->super_MOS6522Storage).last_posted_interrupt_status_ = bVar5;
      (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
      pAVar3 = this->bus_handler_;
      pAVar3->interrupt = bVar5;
      (*((pAVar3->card->super_Card).delegate_)->_vptr_Delegate[1])();
    }
  }
  if ((((this->super_MOS6522Storage).registers_.timer[0] == 0xffff) &&
      ((this->super_MOS6522Storage).registers_.last_timer[0] == 0)) &&
     ((this->super_MOS6522Storage).timer_is_running_[0] == true)) {
    bVar2 = (this->super_MOS6522Storage).last_posted_interrupt_status_;
    bVar4 = (this->super_MOS6522Storage).registers_.interrupt_flags | 0x40;
    (this->super_MOS6522Storage).registers_.interrupt_flags = bVar4;
    bVar5 = (bVar4 & (this->super_MOS6522Storage).registers_.interrupt_enable & 0x7f) != 0;
    if (bVar2 != bVar5) {
      (this->super_MOS6522Storage).last_posted_interrupt_status_ = bVar5;
      (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
      pAVar3 = this->bus_handler_;
      pAVar3->interrupt = bVar5;
      (*((pAVar3->card->super_Card).delegate_)->_vptr_Delegate[1])();
    }
    bVar4 = (this->super_MOS6522Storage).registers_.auxiliary_control;
    if ((bVar4 & 0x40) == 0) {
      (this->super_MOS6522Storage).timer_is_running_[0] = false;
    }
    else {
      (this->super_MOS6522Storage).registers_.timer_needs_reload = true;
    }
    if ((char)bVar4 < '\0') {
      puVar1 = &(this->super_MOS6522Storage).registers_.timer_port_b_output;
      *puVar1 = *puVar1 ^ 0x80;
      (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ = 0;
      Apple::II::Mockingboard::AYVIA::set_port_output
                (this->bus_handler_,B,(this->super_MOS6522Storage).registers_.output[1] | 0x80,
                 (this->super_MOS6522Storage).registers_.data_direction[1] | 0x80);
      return;
    }
  }
  return;
}

Assistant:

void MOS6522<T>::do_phase1() {
	++ time_since_bus_handler_call_;

	// IRQ is raised on the half cycle after overflow
	if((registers_.timer[1] == 0xffff) && !registers_.last_timer[1] && timer_is_running_[1]) {
		timer_is_running_[1] = false;

		// If the shift register is shifting according to this timer, do a shift.
		// TODO: "shift register is driven by only the low order 8 bits of timer 2"?
		switch(shift_mode()) {
			default:												break;
			case ShiftMode::InUnderT2:				shift_in();		break;
			case ShiftMode::OutUnderT2FreeRunning:	shift_out();	break;
			case ShiftMode::OutUnderT2:				shift_out();	break;	// TODO: present a clock on CB1.
		}

		registers_.interrupt_flags |= InterruptFlag::Timer2;
		reevaluate_interrupts();
	}

	if((registers_.timer[0] == 0xffff) && !registers_.last_timer[0] && timer_is_running_[0]) {
		registers_.interrupt_flags |= InterruptFlag::Timer1;
		reevaluate_interrupts();

		// Determine whether to reload.
		if(timer1_is_continuous())
			registers_.timer_needs_reload = true;
		else
			timer_is_running_[0] = false;

		// Determine whether to toggle PB7.
		if(timer1_is_controlling_pb7()) {
			registers_.timer_port_b_output ^= 0x80;
			bus_handler_.run_for(time_since_bus_handler_call_.flush<HalfCycles>());
			evaluate_port_b_output();
		}
	}
}